

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_half_float_linear_BGRA(void *outputp,int width_times_channels,float *encode)

{
  undefined1 (*pauVar1) [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float *pfVar7;
  int iVar8;
  stbir__FP16 *output;
  undefined1 (*pauVar9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar24;
  float fVar26;
  float fVar28;
  undefined1 auVar22 [16];
  float fVar25;
  float fVar27;
  float fVar29;
  undefined1 auVar23 [16];
  
  auVar6 = _DAT_005ecd40;
  pauVar1 = (undefined1 (*) [16])((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      pauVar9 = (undefined1 (*) [16])((long)outputp + 8);
      pfVar7 = encode + 3;
      do {
        fVar21 = ABS(pfVar7[-1]);
        if ((uint)fVar21 < 0x47800000) {
          if ((uint)fVar21 < 0x38800000) {
            fVar25 = fVar21 + 0.5;
          }
          else {
            fVar21 = (float)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar25 = fVar21;
          }
        }
        else {
          fVar25 = (float)((0x7f800000 < (uint)fVar21 | 0x3e) << 9);
        }
        iVar8 = movmskps(fVar21,ZEXT416((uint)pfVar7[-1]));
        *(ushort *)(pauVar9[-1] + 8) = (ushort)(iVar8 << 0xf) | SUB42(fVar25,0);
        fVar21 = ABS(pfVar7[-2]);
        if ((uint)fVar21 < 0x47800000) {
          if ((uint)fVar21 < 0x38800000) {
            fVar25 = fVar21 + 0.5;
          }
          else {
            fVar21 = (float)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar25 = fVar21;
          }
        }
        else {
          fVar25 = (float)((0x7f800000 < (uint)fVar21 | 0x3e) << 9);
        }
        iVar8 = movmskps(fVar21,ZEXT416((uint)pfVar7[-2]));
        *(ushort *)(pauVar9[-1] + 10) = (ushort)(iVar8 << 0xf) | SUB42(fVar25,0);
        fVar21 = ABS(pfVar7[-3]);
        if ((uint)fVar21 < 0x47800000) {
          if ((uint)fVar21 < 0x38800000) {
            fVar25 = fVar21 + 0.5;
          }
          else {
            fVar21 = (float)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar25 = fVar21;
          }
        }
        else {
          fVar25 = (float)((0x7f800000 < (uint)fVar21 | 0x3e) << 9);
        }
        iVar8 = movmskps(fVar21,ZEXT416((uint)pfVar7[-3]));
        *(ushort *)(pauVar9[-1] + 0xc) = (ushort)(iVar8 << 0xf) | SUB42(fVar25,0);
        fVar21 = ABS(*pfVar7);
        if ((uint)fVar21 < 0x47800000) {
          if ((uint)fVar21 < 0x38800000) {
            fVar25 = fVar21 + 0.5;
          }
          else {
            fVar21 = (float)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar25 = fVar21;
          }
        }
        else {
          fVar25 = (float)((0x7f800000 < (uint)fVar21 | 0x3e) << 9);
        }
        iVar8 = movmskps(fVar21,ZEXT416((uint)*pfVar7));
        *(ushort *)(pauVar9[-1] + 0xe) = (ushort)(iVar8 << 0xf) | SUB42(fVar25,0);
        pauVar9 = (undefined1 (*) [16])((long)*pauVar9 + 8);
        pfVar7 = pfVar7 + 4;
      } while (pauVar9 <= pauVar1);
    }
  }
  else {
    pfVar7 = encode;
    do {
      do {
        fVar21 = *pfVar7;
        fVar25 = pfVar7[1];
        fVar27 = pfVar7[2];
        fVar29 = pfVar7[3];
        fVar2 = pfVar7[4];
        fVar3 = pfVar7[5];
        fVar4 = pfVar7[6];
        fVar5 = pfVar7[7];
        fVar20 = ABS(fVar27);
        fVar24 = ABS(fVar25);
        fVar26 = ABS(fVar21);
        fVar28 = ABS(fVar29);
        auVar13._0_4_ = -(uint)(-0x47800001 < (int)((uint)fVar20 | 0x80000000));
        auVar13._4_4_ = -(uint)(-0x47800001 < (int)((uint)fVar24 | 0x80000000));
        auVar13._8_4_ = -(uint)(-0x47800001 < (int)((uint)fVar26 | 0x80000000));
        auVar13._12_4_ = -(uint)(-0x47800001 < (int)((uint)fVar28 | 0x80000000));
        auVar16._0_4_ = (int)(fVar20 + 0.5) + -0x3f000000;
        auVar16._4_4_ = (int)(fVar24 + 0.5) + -0x3f000000;
        auVar16._8_4_ = (int)(fVar26 + 0.5) + -0x3f000000;
        auVar16._12_4_ = (int)(fVar28 + 0.5) + -0x3f000000;
        auVar22._0_4_ = (int)fVar20 + -0x37fff001 + ((uint)fVar20 >> 0xd & 1) >> 0xd;
        auVar22._4_4_ = (int)fVar24 + -0x37fff001 + ((uint)fVar24 >> 0xd & 1) >> 0xd;
        auVar22._8_4_ = (int)fVar26 + -0x37fff001 + ((uint)fVar26 >> 0xd & 1) >> 0xd;
        auVar22._12_4_ = (int)fVar28 + -0x37fff001 + ((uint)fVar28 >> 0xd & 1) >> 0xd;
        auVar18._0_4_ = -(uint)(-0x38800001 < (int)((uint)fVar20 | 0x80000000));
        auVar18._4_4_ = -(uint)(-0x38800001 < (int)((uint)fVar24 | 0x80000000));
        auVar18._8_4_ = -(uint)(-0x38800001 < (int)((uint)fVar26 | 0x80000000));
        auVar18._12_4_ = -(uint)(-0x38800001 < (int)((uint)fVar28 | 0x80000000));
        auVar10._0_4_ = (-(uint)NAN(fVar27) & 0x200 | 0x7c00) & auVar18._0_4_;
        auVar10._4_4_ = (-(uint)NAN(fVar25) & 0x200 | 0x7c00) & auVar18._4_4_;
        auVar10._8_4_ = (-(uint)NAN(fVar21) & 0x200 | 0x7c00) & auVar18._8_4_;
        auVar10._12_4_ = (-(uint)NAN(fVar29) & 0x200 | 0x7c00) & auVar18._12_4_;
        auVar15._0_4_ = (int)fVar27 >> 0x10;
        auVar15._4_4_ = (int)fVar25 >> 0x10;
        auVar15._8_4_ = (int)fVar21 >> 0x10;
        auVar15._12_4_ = (int)fVar29 >> 0x10;
        fVar21 = ABS(fVar4);
        fVar25 = ABS(fVar3);
        fVar27 = ABS(fVar2);
        fVar29 = ABS(fVar5);
        auVar14._0_4_ = -(uint)(-0x47800001 < (int)((uint)fVar21 | 0x80000000));
        auVar14._4_4_ = -(uint)(-0x47800001 < (int)((uint)fVar25 | 0x80000000));
        auVar14._8_4_ = -(uint)(-0x47800001 < (int)((uint)fVar27 | 0x80000000));
        auVar14._12_4_ = -(uint)(-0x47800001 < (int)((uint)fVar29 | 0x80000000));
        auVar11._0_4_ = (int)(fVar21 + 0.5) + -0x3f000000;
        auVar11._4_4_ = (int)(fVar25 + 0.5) + -0x3f000000;
        auVar11._8_4_ = (int)(fVar27 + 0.5) + -0x3f000000;
        auVar11._12_4_ = (int)(fVar29 + 0.5) + -0x3f000000;
        auVar23._0_4_ = (int)fVar21 + -0x37fff001 + ((uint)fVar21 >> 0xd & 1) >> 0xd;
        auVar23._4_4_ = (int)fVar25 + -0x37fff001 + ((uint)fVar25 >> 0xd & 1) >> 0xd;
        auVar23._8_4_ = (int)fVar27 + -0x37fff001 + ((uint)fVar27 >> 0xd & 1) >> 0xd;
        auVar23._12_4_ = (int)fVar29 + -0x37fff001 + ((uint)fVar29 >> 0xd & 1) >> 0xd;
        auVar19._0_4_ = -(uint)(-0x38800001 < (int)((uint)fVar21 | 0x80000000));
        auVar19._4_4_ = -(uint)(-0x38800001 < (int)((uint)fVar25 | 0x80000000));
        auVar19._8_4_ = -(uint)(-0x38800001 < (int)((uint)fVar27 | 0x80000000));
        auVar19._12_4_ = -(uint)(-0x38800001 < (int)((uint)fVar29 | 0x80000000));
        auVar12._0_4_ = (-(uint)NAN(fVar4) & 0x200 | 0x7c00) & auVar19._0_4_;
        auVar12._4_4_ = (-(uint)NAN(fVar3) & 0x200 | 0x7c00) & auVar19._4_4_;
        auVar12._8_4_ = (-(uint)NAN(fVar2) & 0x200 | 0x7c00) & auVar19._8_4_;
        auVar12._12_4_ = (-(uint)NAN(fVar5) & 0x200 | 0x7c00) & auVar19._12_4_;
        auVar17._0_4_ = (int)fVar4 >> 0x10;
        auVar17._4_4_ = (int)fVar3 >> 0x10;
        auVar17._8_4_ = (int)fVar2 >> 0x10;
        auVar17._12_4_ = (int)fVar5 >> 0x10;
        auVar16 = packssdw(auVar15 & auVar6 | auVar10 |
                           ~auVar18 & (~auVar13 & auVar16 | auVar22 & auVar13),
                           auVar17 & auVar6 | auVar12 |
                           ~auVar19 & (~auVar14 & auVar11 | auVar23 & auVar14));
        *(undefined1 (*) [16])outputp = auVar16;
        pauVar9 = (undefined1 (*) [16])((long)outputp + 0x10);
        pfVar7 = pfVar7 + 8;
        outputp = pauVar9;
      } while (pauVar9 <= pauVar1 + -1);
      pfVar7 = encode + (long)width_times_channels + -8;
      outputp = pauVar1 + -1;
    } while (pauVar9 != pauVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}